

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

StringPtr * __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::insert
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this,
          StringPtr *row)

{
  uint uVar1;
  ulong uVar2;
  StringPtr *pSVar3;
  long lVar4;
  int local_6c;
  Iterator iter;
  long local_50;
  long local_48;
  SearchKey local_40;
  Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *local_38;
  long *local_30;
  int *local_28;
  
  local_50 = *(long *)this;
  lVar4 = *(long *)(this + 8) - local_50 >> 2;
  local_38 = this + 0x20;
  local_6c = *(int *)&(row->content).ptr;
  local_28 = &local_6c;
  local_30 = &local_50;
  local_40._vptr_SearchKey = (_func_int **)&PTR_search_001c6c20;
  local_48 = lVar4;
  _::BTreeImpl::insert(&iter,(BTreeImpl *)(this + 0x28),&local_40);
  uVar2 = (ulong)iter.row;
  if (uVar2 == 0xe) {
    uVar2 = 0xe;
  }
  else {
    uVar1 = (iter.leaf)->rows[uVar2].i;
    if ((uVar1 != 0) && (*(int *)(local_50 + (ulong)(uVar1 - 1) * 4) == local_6c)) {
      _::throwDuplicateTableRow();
    }
  }
  memmove((iter.leaf)->rows + uVar2 + 1,(iter.leaf)->rows + uVar2,(ulong)(iter.row + 1) * -4 + 0x38)
  ;
  (iter.leaf)->rows[uVar2].i = (int)lVar4 + 1;
  pSVar3 = Vector<unsigned_int>::add<unsigned_int>((Vector<unsigned_int> *)this,row);
  return pSVar3;
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }